

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

int jp2_write_jp2c(opj_jp2_t *jp2,opj_cio_t *cio,opj_image_t *image,opj_codestream_info_t *cstr_info
                  )

{
  int pos;
  int iVar1;
  opj_bool oVar2;
  int iVar3;
  opj_cio_t *in_RSI;
  long in_RDI;
  opj_j2k_t *j2k;
  opj_cio_t *in_stack_00000008;
  opj_jp2_box_t box;
  uint j2k_codestream_length;
  uint j2k_codestream_offset;
  undefined8 *puVar4;
  int n;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  puVar4 = *(undefined8 **)(in_RDI + 8);
  pos = cio_tell(in_RSI);
  cio_skip(in_RSI,4);
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffc8),
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (int)((ulong)puVar4 >> 0x20));
  iVar1 = cio_tell(in_RSI);
  oVar2 = j2k_encode((opj_j2k_t *)box._4_8_,in_stack_00000008,(opj_image_t *)j2k,
                     (opj_codestream_info_t *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (oVar2 == 0) {
    opj_event_msg((opj_common_ptr)*puVar4,1,"Failed to encode image\n");
    iVar1 = 0;
  }
  else {
    iVar3 = cio_tell(in_RSI);
    n = (int)((ulong)puVar4 >> 0x20);
    *(int *)(in_RDI + 0x58) = iVar1;
    *(int *)(in_RDI + 0x5c) = iVar3 - iVar1;
    iVar1 = *(int *)(in_RDI + 0x5c) + 8;
    cio_seek(in_RSI,pos);
    cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffc8),
              CONCAT44(iVar1,in_stack_ffffffffffffffc0),n);
    cio_seek(in_RSI,pos + iVar1);
  }
  return iVar1;
}

Assistant:

static int jp2_write_jp2c(opj_jp2_t *jp2, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	unsigned int j2k_codestream_offset, j2k_codestream_length;
	opj_jp2_box_t box;

	opj_j2k_t *j2k = jp2->j2k;

	box.init_pos = cio_tell(cio);
	cio_skip(cio, 4);
	cio_write(cio, JP2_JP2C, 4);	/* JP2C */

	/* J2K encoding */
	j2k_codestream_offset = cio_tell(cio);
	if(!j2k_encode(j2k, cio, image, cstr_info)) {
		opj_event_msg(j2k->cinfo, EVT_ERROR, "Failed to encode image\n");
		return 0;
	}
	j2k_codestream_length = cio_tell(cio) - j2k_codestream_offset;

	jp2->j2k_codestream_offset = j2k_codestream_offset;
	jp2->j2k_codestream_length = j2k_codestream_length;

	box.length = 8 + jp2->j2k_codestream_length;
	cio_seek(cio, box.init_pos);
	cio_write(cio, box.length, 4);	/* L */
	cio_seek(cio, box.init_pos + box.length);

	return box.length;
}